

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void print_code(vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>
                *v,vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *errors)

{
  ulong uVar1;
  enableStd<rang::fg> pbVar2;
  ostream *os;
  ulong uVar3;
  shared_ptr<StringLine> *it;
  pointer sl;
  __normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
  eit;
  char local_41;
  pointer local_40;
  __normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
  local_38;
  
  system("clear");
  local_38._M_current =
       (errors->super__Vector_base<ErrorInfoException,_std::allocator<ErrorInfoException>_>)._M_impl
       .super__Vector_impl_data._M_start;
  sl = (v->
       super__Vector_base<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_40 = (v->
             super__Vector_base<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (sl != local_40) {
    do {
      pbVar2 = rang::operator<<((ostream *)&std::cout,yellow);
      os = (ostream *)
           std::ostream::operator<<
                     ((ostream *)pbVar2,
                      ((sl->super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                      line);
      pbVar2 = rang::operator<<(os,reset);
      std::__ostream_insert<char,std::char_traits<char>>(pbVar2,": ",2);
      if ((((sl->super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->text).
          _M_string_length != 0) {
        uVar3 = 0;
        do {
          uVar1 = uVar3 + 1;
          print_error_color(&local_38,errors,sl,(int)uVar1);
          local_41 = (((sl->super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                     text)._M_dataplus._M_p[uVar3];
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_41,1);
          uVar3 = uVar1;
        } while (uVar1 < (((sl->super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                         ->text)._M_string_length);
      }
      reset_error_color(&local_38,errors);
      sl = sl + 1;
    } while (sl != local_40);
  }
  return;
}

Assistant:

void print_code(const vector<shared_ptr<StringLine>> &v, const vector<ErrorInfoException> &errors) {
    system("clear");
    __gnu_cxx::__normal_iterator<const ErrorInfoException *, vector<ErrorInfoException, allocator<ErrorInfoException>>> eit = errors.begin();
    for (const auto &it : v) {
        cout << fg::yellow << it->get_line() << fg::reset << ": ";
        for (int i = 0; i < it->get_text().size(); ++i) {
            int column = i + 1;
            print_error_color(eit, errors, it, column);
            cout << it->get_text()[i];
        }
        reset_error_color(eit, errors);
    }
}